

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_header.c
# Opt level: O2

char * cmime_header_get_value(CMimeHeader_T *header,int pos)

{
  uint __line;
  char *pcVar1;
  
  if (header == (CMimeHeader_T *)0x0) {
    pcVar1 = "header";
    __line = 0x59;
  }
  else {
    if ((ulong)(long)pos <= header->count) {
      if (header->value == (char **)0x0) {
        pcVar1 = (char *)0x0;
      }
      else {
        pcVar1 = header->value[pos];
      }
      return pcVar1;
    }
    pcVar1 = "pos <= header->count";
    __line = 0x5a;
  }
  __assert_fail(pcVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_header.c"
                ,__line,"char *cmime_header_get_value(CMimeHeader_T *, int)");
}

Assistant:

char *cmime_header_get_value(CMimeHeader_T *header,int pos) {
    assert(header);
    assert(pos <= header->count);
    
    if (header->value != NULL)
        return(header->value[pos]);
    else
        return(NULL);
}